

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  void *pvVar1;
  ImFontAtlas *local_150;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImRect local_54;
  ImVec2 local_44;
  undefined1 local_39;
  void *local_38;
  ImFontAtlas *local_30;
  ImFontAtlas *local_18;
  ImFontAtlas *shared_font_atlas_local;
  ImGuiContext *this_local;
  
  local_18 = shared_font_atlas;
  shared_font_atlas_local = (ImFontAtlas *)this;
  ImGuiIO::ImGuiIO(&this->IO);
  ImGuiStyle::ImGuiStyle(&this->Style);
  ImDrawListSharedData::ImDrawListSharedData(&this->DrawListSharedData);
  ImVector<ImGuiWindow_*>::ImVector(&this->Windows);
  ImVector<ImGuiWindow_*>::ImVector(&this->WindowsFocusOrder);
  ImVector<ImGuiWindow_*>::ImVector(&this->WindowsTempSortBuffer);
  ImVector<ImGuiWindow_*>::ImVector(&this->CurrentWindowStack);
  ImGuiStorage::ImGuiStorage(&this->WindowsById);
  ImVec2::ImVec2(&this->WheelingWindowRefMousePos);
  ImVec2::ImVec2(&this->ActiveIdClickOffset);
  ImGuiNextWindowData::ImGuiNextWindowData(&this->NextWindowData);
  ImGuiNextItemData::ImGuiNextItemData(&this->NextItemData);
  ImVector<ImGuiColorMod>::ImVector(&this->ColorModifiers);
  ImVector<ImGuiStyleMod>::ImVector(&this->StyleModifiers);
  ImVector<ImFont_*>::ImVector(&this->FontStack);
  ImVector<ImGuiPopupData>::ImVector(&this->OpenPopupStack);
  ImVector<ImGuiPopupData>::ImVector(&this->BeginPopupStack);
  ImRect::ImRect(&this->NavScoringRect);
  ImRect::ImRect(&this->NavInitResultRectRel);
  ImGuiNavMoveResult::ImGuiNavMoveResult(&this->NavMoveResultLocal);
  ImGuiNavMoveResult::ImGuiNavMoveResult(&this->NavMoveResultLocalVisibleSet);
  ImGuiNavMoveResult::ImGuiNavMoveResult(&this->NavMoveResultOther);
  ImDrawData::ImDrawData(&this->DrawData);
  ImDrawDataBuilder::ImDrawDataBuilder(&this->DrawDataBuilder);
  ImDrawList::ImDrawList(&this->BackgroundDrawList,&this->DrawListSharedData);
  ImDrawList::ImDrawList(&this->ForegroundDrawList,&this->DrawListSharedData);
  ImGuiPayload::ImGuiPayload(&this->DragDropPayload);
  ImRect::ImRect(&this->DragDropTargetRect);
  ImVector<unsigned_char>::ImVector(&this->DragDropPayloadBufHeap);
  ImPool<ImGuiTabBar>::ImPool(&this->TabBars);
  ImVector<ImGuiPtrOrIndex>::ImVector(&this->CurrentTabBarStack);
  ImVector<ImGuiShrinkWidthItem>::ImVector(&this->ShrinkWidthBuffer);
  ImVec2::ImVec2(&this->LastValidMousePos);
  ImGuiInputTextState::ImGuiInputTextState(&this->InputTextState);
  ImFont::ImFont(&this->InputTextPasswordFont);
  ImVec4::ImVec4(&this->ColorPickerRef);
  ImVector<char>::ImVector(&this->ClipboardHandlerData);
  ImVector<unsigned_int>::ImVector(&this->MenusIdSubmittedThisFrame);
  ImVec2::ImVec2(&this->PlatformImePos);
  ImVec2::ImVec2(&this->PlatformImeLastPos);
  ImGuiTextBuffer::ImGuiTextBuffer(&this->SettingsIniData);
  ImVector<ImGuiSettingsHandler>::ImVector(&this->SettingsHandlers);
  ImChunkStream<ImGuiWindowSettings>::ImChunkStream(&this->SettingsWindows);
  ImGuiTextBuffer::ImGuiTextBuffer(&this->LogBuffer);
  this->Initialized = false;
  this->FontAtlasOwnedByContext = (bool)(-(local_18 == (ImFontAtlas *)0x0) & 1);
  this->Font = (ImFont *)0x0;
  this->FontBaseSize = 0.0;
  this->FontSize = 0.0;
  local_39 = 0;
  if (local_18 == (ImFontAtlas *)0x0) {
    pvVar1 = ImGui::MemAlloc(0x78);
    local_150 = (ImFontAtlas *)operator_new(0x78);
    local_39 = 1;
    local_38 = pvVar1;
    local_30 = local_150;
    ImFontAtlas::ImFontAtlas(local_150);
  }
  else {
    local_150 = local_18;
  }
  (this->IO).Fonts = local_150;
  this->Time = 0.0;
  this->FrameCount = 0;
  this->FrameCountRendered = -1;
  this->FrameCountEnded = -1;
  this->WithinEndChild = false;
  this->WithinFrameScopeWithImplicitWindow = false;
  this->WithinFrameScope = false;
  this->TestEngineHookItems = false;
  this->TestEngineHookIdInfo = 0;
  this->TestEngine = (void *)0x0;
  this->WindowsActiveCount = 0;
  this->CurrentWindow = (ImGuiWindow *)0x0;
  this->HoveredWindow = (ImGuiWindow *)0x0;
  this->HoveredRootWindow = (ImGuiWindow *)0x0;
  this->MovingWindow = (ImGuiWindow *)0x0;
  this->WheelingWindow = (ImGuiWindow *)0x0;
  this->WheelingWindowTimer = 0.0;
  this->HoveredId = 0;
  this->HoveredIdAllowOverlap = false;
  this->HoveredIdPreviousFrame = 0;
  this->HoveredIdNotActiveTimer = 0.0;
  this->HoveredIdTimer = 0.0;
  this->ActiveId = 0;
  this->ActiveIdIsAlive = 0;
  this->ActiveIdTimer = 0.0;
  this->ActiveIdIsJustActivated = false;
  this->ActiveIdAllowOverlap = false;
  this->ActiveIdHasBeenPressedBefore = false;
  this->ActiveIdHasBeenEditedBefore = false;
  this->ActiveIdHasBeenEditedThisFrame = false;
  this->ActiveIdUsingNavDirMask = 0;
  this->ActiveIdUsingNavInputMask = 0;
  this->ActiveIdUsingKeyInputMask = 0;
  ImVec2::ImVec2(&local_44,-1.0,-1.0);
  this->ActiveIdClickOffset = local_44;
  this->ActiveIdWindow = (ImGuiWindow *)0x0;
  this->ActiveIdSource = ImGuiInputSource_None;
  this->ActiveIdMouseButton = 0;
  this->ActiveIdPreviousFrame = 0;
  this->ActiveIdPreviousFrameIsAlive = false;
  this->ActiveIdPreviousFrameHasBeenEditedBefore = false;
  this->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
  this->LastActiveId = 0;
  this->LastActiveIdTimer = 0.0;
  this->NavWindow = (ImGuiWindow *)0x0;
  this->NavInputId = 0;
  this->NavActivatePressedId = 0;
  this->NavActivateDownId = 0;
  this->NavActivateId = 0;
  this->NavFocusScopeId = 0;
  this->NavId = 0;
  this->NavNextActivateId = 0;
  this->NavJustMovedToFocusScopeId = 0;
  this->NavJustMovedToId = 0;
  this->NavJustTabbedId = 0;
  this->NavJustMovedToKeyMods = 0;
  this->NavInputSource = ImGuiInputSource_None;
  ImRect::ImRect(&local_54);
  (this->NavScoringRect).Min = local_54.Min;
  (this->NavScoringRect).Max = local_54.Max;
  this->NavScoringCount = 0;
  this->NavLayer = ImGuiNavLayer_Main;
  this->NavIdTabCounter = 0x7fffffff;
  this->NavIdIsAlive = false;
  this->NavMousePosDirty = false;
  this->NavDisableHighlight = true;
  this->NavDisableMouseHover = false;
  this->NavAnyRequest = false;
  this->NavInitRequest = false;
  this->NavInitRequestFromMove = false;
  this->NavInitResultId = 0;
  this->NavMoveFromClampedRefRect = false;
  this->NavMoveRequest = false;
  this->NavMoveRequestFlags = 0;
  this->NavMoveRequestForward = ImGuiNavForward_None;
  this->NavMoveRequestKeyMods = 0;
  this->NavMoveClipDir = -1;
  this->NavMoveDirLast = -1;
  this->NavMoveDir = -1;
  this->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  this->NavWrapRequestFlags = 0;
  this->NavWindowingListWindow = (ImGuiWindow *)0x0;
  this->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
  this->NavWindowingTarget = (ImGuiWindow *)0x0;
  this->NavWindowingHighlightAlpha = 0.0;
  this->NavWindowingTimer = 0.0;
  this->NavWindowingToggleLayer = false;
  this->FocusRequestNextWindow = (ImGuiWindow *)0x0;
  this->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  this->FocusRequestCurrCounterTabStop = 0x7fffffff;
  this->FocusRequestCurrCounterRegular = 0x7fffffff;
  this->FocusRequestNextCounterTabStop = 0x7fffffff;
  this->FocusRequestNextCounterRegular = 0x7fffffff;
  this->FocusTabPressed = false;
  this->DimBgRatio = 0.0;
  (this->BackgroundDrawList)._OwnerName = "##Background";
  (this->ForegroundDrawList)._OwnerName = "##Foreground";
  this->MouseCursor = 0;
  this->DragDropWithinTarget = false;
  this->DragDropWithinSource = false;
  this->DragDropActive = false;
  this->DragDropSourceFlags = 0;
  this->DragDropSourceFrameCount = -1;
  this->DragDropMouseButton = -1;
  this->DragDropTargetId = 0;
  this->DragDropAcceptFlags = 0;
  this->DragDropAcceptIdCurrRectSurface = 0.0;
  this->DragDropAcceptIdCurr = 0;
  this->DragDropAcceptIdPrev = 0;
  this->DragDropAcceptFrameCount = -1;
  this->DragDropHoldJustPressedId = 0;
  this->DragDropPayloadBufLocal[0] = '\0';
  this->DragDropPayloadBufLocal[1] = '\0';
  this->DragDropPayloadBufLocal[2] = '\0';
  this->DragDropPayloadBufLocal[3] = '\0';
  this->DragDropPayloadBufLocal[4] = '\0';
  this->DragDropPayloadBufLocal[5] = '\0';
  this->DragDropPayloadBufLocal[6] = '\0';
  this->DragDropPayloadBufLocal[7] = '\0';
  this->DragDropPayloadBufLocal[8] = '\0';
  this->DragDropPayloadBufLocal[9] = '\0';
  this->DragDropPayloadBufLocal[10] = '\0';
  this->DragDropPayloadBufLocal[0xb] = '\0';
  this->DragDropPayloadBufLocal[0xc] = '\0';
  this->DragDropPayloadBufLocal[0xd] = '\0';
  this->DragDropPayloadBufLocal[0xe] = '\0';
  this->DragDropPayloadBufLocal[0xf] = '\0';
  this->CurrentTabBar = (ImGuiTabBar *)0x0;
  ImVec2::ImVec2(&local_5c,0.0,0.0);
  this->LastValidMousePos = local_5c;
  this->TempInputId = 0;
  this->ColorEditOptions = 0xa900000;
  this->ColorEditLastSat = 0.0;
  this->ColorEditLastHue = 0.0;
  this->ColorEditLastColor[2] = 3.4028235e+38;
  this->ColorEditLastColor[1] = 3.4028235e+38;
  this->ColorEditLastColor[0] = 3.4028235e+38;
  this->DragCurrentAccumDirty = false;
  this->DragCurrentAccum = 0.0;
  this->DragSpeedDefaultRatio = 0.01;
  this->ScrollbarClickDeltaToGrabCenter = 0.0;
  this->TooltipOverrideCount = 0;
  ImVec2::ImVec2(&local_64,3.4028235e+38,3.4028235e+38);
  this->PlatformImeLastPos = local_64;
  this->PlatformImePos = this->PlatformImeLastPos;
  this->SettingsLoaded = false;
  this->SettingsDirtyTimer = 0.0;
  this->LogEnabled = false;
  this->LogType = ImGuiLogType_None;
  this->LogFile = (ImFileHandle)0x0;
  this->LogLinePosY = 3.4028235e+38;
  this->LogLineFirstItem = false;
  this->LogDepthRef = 0;
  this->LogDepthToExpandDefault = 2;
  this->LogDepthToExpand = 2;
  this->DebugItemPickerActive = false;
  this->DebugItemPickerBreakId = 0;
  memset(this->FramerateSecPerFrame,0,0x1e0);
  this->FramerateSecPerFrameIdx = 0;
  this->FramerateSecPerFrameAccum = 0.0;
  this->WantTextInputNextFrame = -1;
  this->WantCaptureKeyboardNextFrame = -1;
  this->WantCaptureMouseNextFrame = -1;
  memset(this->TempBuffer,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas) : BackgroundDrawList(&DrawListSharedData), ForegroundDrawList(&DrawListSharedData)
    {
        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        TestEngineHookItems = false;
        TestEngineHookIdInfo = 0;
        TestEngine = NULL;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowTimer = 0.0f;

        HoveredId = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdPreviousFrame = 0;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingNavInputMask = 0x00;
        ActiveIdUsingKeyInputMask = 0x00;
        ActiveIdClickOffset = ImVec2(-1,-1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavInputId = 0;
        NavJustTabbedId = NavJustMovedToId = NavJustMovedToFocusScopeId = NavNextActivateId = 0;
        NavJustMovedToKeyMods = ImGuiKeyModFlags_None;
        NavInputSource = ImGuiInputSource_None;
        NavScoringRect = ImRect();
        NavScoringCount = 0;
        NavLayer = ImGuiNavLayer_Main;
        NavIdTabCounter = INT_MAX;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveFromClampedRefRect = false;
        NavMoveRequest = false;
        NavMoveRequestFlags = ImGuiNavMoveFlags_None;
        NavMoveRequestForward = ImGuiNavForward_None;
        NavMoveRequestKeyMods = ImGuiKeyModFlags_None;
        NavMoveDir = NavMoveDirLast = NavMoveClipDir = ImGuiDir_None;
        NavWrapRequestWindow = NULL;
        NavWrapRequestFlags = ImGuiNavMoveFlags_None;

        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;

        FocusRequestCurrWindow = FocusRequestNextWindow = NULL;
        FocusRequestCurrCounterRegular = FocusRequestCurrCounterTabStop = INT_MAX;
        FocusRequestNextCounterRegular = FocusRequestNextCounterTabStop = INT_MAX;
        FocusTabPressed = false;

        DimBgRatio = 0.0f;
        BackgroundDrawList._OwnerName = "##Background"; // Give it a name for debugging
        ForegroundDrawList._OwnerName = "##Foreground"; // Give it a name for debugging
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        CurrentTabBar = NULL;

        LastValidMousePos = ImVec2(0.0f, 0.0f);
        TempInputId = 0;
        ColorEditOptions = ImGuiColorEditFlags__OptionsDefault;
        ColorEditLastHue = ColorEditLastSat = 0.0f;
        ColorEditLastColor[0] = ColorEditLastColor[1] = ColorEditLastColor[2] = FLT_MAX;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        TooltipOverrideCount = 0;

        PlatformImePos = PlatformImeLastPos = ImVec2(FLT_MAX, FLT_MAX);

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugItemPickerActive = false;
        DebugItemPickerBreakId = 0;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }